

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# json.cpp
# Opt level: O3

Error * ot::commissioner::PendingDatasetFromJson
                  (Error *__return_storage_ptr__,PendingOperationalDataset *aDataset,string *aJson)

{
  char cVar1;
  __normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  first;
  char *from;
  char *to;
  anon_union_8_2_de49483c_for_basic_format_args<fmt::v10::basic_format_context<fmt::v10::appender,_char>_>_2
  in_R9;
  format_args args;
  Json json;
  writer write;
  undefined1 local_198 [16];
  undefined1 local_188 [8];
  __shared_count<(__gnu_cxx::_Lock_policy)2> local_180;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> local_170;
  string local_160;
  writer local_140;
  _Any_data local_138;
  code *local_128;
  undefined8 uStack_120;
  undefined1 local_118 [40];
  _Alloc_hider local_f0;
  char local_e0 [24];
  vector<ot::commissioner::ChannelMaskEntry,_std::allocator<ot::commissioner::ChannelMaskEntry>_>
  local_c8;
  pointer local_b0;
  pointer local_98;
  pointer local_80;
  pointer local_60;
  undefined8 local_44;
  undefined4 local_3c;
  
  __return_storage_ptr__->mCode = kNone;
  (__return_storage_ptr__->mMessage)._M_dataplus._M_p =
       (pointer)&(__return_storage_ptr__->mMessage).field_2;
  (__return_storage_ptr__->mMessage)._M_string_length = 0;
  (__return_storage_ptr__->mMessage).field_2._M_local_buf[0] = '\0';
  PendingOperationalDataset::PendingOperationalDataset((PendingOperationalDataset *)local_118);
  ActiveOperationalDataset::operator=
            (&aDataset->super_ActiveOperationalDataset,(ActiveOperationalDataset *)local_118);
  *(undefined4 *)&(aDataset->mPendingTimestamp).field_0x4 = local_3c;
  *(undefined8 *)&(aDataset->super_ActiveOperationalDataset).field_0xd4 = local_44;
  if (local_60 != (pointer)0x0) {
    operator_delete(local_60);
  }
  if (local_80 != (pointer)0x0) {
    operator_delete(local_80);
  }
  if (local_98 != (pointer)0x0) {
    operator_delete(local_98);
  }
  if (local_b0 != (pointer)0x0) {
    operator_delete(local_b0);
  }
  std::
  vector<ot::commissioner::ChannelMaskEntry,_std::allocator<ot::commissioner::ChannelMaskEntry>_>::
  ~vector(&local_c8);
  if (local_f0._M_p != local_e0) {
    operator_delete(local_f0._M_p);
  }
  if ((pointer)local_118._8_8_ != (pointer)0x0) {
    operator_delete((void *)local_118._8_8_);
  }
  StripComments((string *)local_118,aJson);
  first._M_current._4_4_ = local_118._4_4_;
  first._M_current._0_4_ = local_118._0_4_;
  nlohmann::detail::input_adapter::
  input_adapter<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_0>
            ((input_adapter *)local_188,first,
             (__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
              )(local_118._8_8_ + first._M_current));
  local_128 = (code *)0x0;
  uStack_120 = 0;
  local_138._M_unused._M_object = (void *)0x0;
  local_138._8_8_ = 0;
  nlohmann::
  basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>
  ::parse((basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>
           *)local_198,(input_adapter *)local_188,(parser_callback_t *)&local_138,true);
  if (local_128 != (code *)0x0) {
    (*local_128)(&local_138,&local_138,__destroy_functor);
  }
  if (local_180._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(local_180._M_pi);
  }
  if ((undefined1 *)CONCAT44(local_118._4_4_,local_118._0_4_) != local_118 + 0x10) {
    operator_delete((undefined1 *)CONCAT44(local_118._4_4_,local_118._0_4_));
  }
  if (local_198[0] == null) {
    local_118._0_4_ = none_type;
    from = "Empty pending operational dataset from JSON";
    local_118._8_8_ = "Empty pending operational dataset from JSON";
    local_118._16_8_ = (pointer)0x2b;
    local_118._24_8_ = (pointer)0x0;
    local_f0._M_p = (char *)0x0;
    local_140.handler_ =
         (format_string_checker<char,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
          *)local_118;
    local_118._32_8_ =
         (format_string_checker<char,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
          *)local_118;
    do {
      cVar1 = *from;
      to = from;
      while (cVar1 != '{') {
        to = to + 1;
        if (to == "") {
          ::fmt::v10::detail::
          parse_format_string<true,_char,_fmt::v10::detail::format_string_checker<char>_>::writer::
          operator()(&local_140,from,"");
          goto LAB_0012c3f8;
        }
        cVar1 = *to;
      }
      ::fmt::v10::detail::
      parse_format_string<true,_char,_fmt::v10::detail::format_string_checker<char>_>::writer::
      operator()(&local_140,from,to);
      from = ::fmt::v10::detail::
             parse_replacement_field<char,fmt::v10::detail::format_string_checker<char>&>
                       (to,"",(format_string_checker<char,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                               *)local_118);
    } while (from != "");
LAB_0012c3f8:
    args.field_1.args_ = in_R9.args_;
    args.desc_ = (unsigned_long_long)local_118;
    ::fmt::v10::vformat_abi_cxx11_
              (&local_160,(v10 *)"Empty pending operational dataset from JSON",
               (string_view)ZEXT816(0x2b),args);
    local_188._0_4_ = kNotFound;
    local_180._M_pi = &local_170;
    std::__cxx11::string::_M_construct<char*>
              ((string *)&local_180,local_160._M_dataplus._M_p,
               local_160._M_dataplus._M_p + local_160._M_string_length);
    __return_storage_ptr__->mCode = local_188._0_4_;
    std::__cxx11::string::operator=
              ((string *)&__return_storage_ptr__->mMessage,(string *)&local_180);
    if (local_180._M_pi != &local_170) {
      operator_delete(local_180._M_pi);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_160._M_dataplus._M_p == &local_160.field_2) goto LAB_0012c329;
  }
  else {
    nlohmann::
    basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>
    ::
    get<ot::commissioner::PendingOperationalDataset,_ot::commissioner::PendingOperationalDataset,_0>
              ((PendingOperationalDataset *)local_118,
               (basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>
                *)local_198);
    ActiveOperationalDataset::operator=
              (&aDataset->super_ActiveOperationalDataset,(ActiveOperationalDataset *)local_118);
    *(undefined4 *)&(aDataset->mPendingTimestamp).field_0x4 = local_3c;
    *(undefined8 *)&(aDataset->super_ActiveOperationalDataset).field_0xd4 = local_44;
    if (local_60 != (pointer)0x0) {
      operator_delete(local_60);
    }
    if (local_80 != (pointer)0x0) {
      operator_delete(local_80);
    }
    if (local_98 != (pointer)0x0) {
      operator_delete(local_98);
    }
    if (local_b0 != (pointer)0x0) {
      operator_delete(local_b0);
    }
    std::
    vector<ot::commissioner::ChannelMaskEntry,_std::allocator<ot::commissioner::ChannelMaskEntry>_>
    ::~vector(&local_c8);
    if (local_f0._M_p != local_e0) {
      operator_delete(local_f0._M_p);
    }
    local_160._M_dataplus._M_p = (pointer)local_118._8_8_;
    if ((pointer)local_118._8_8_ == (pointer)0x0) goto LAB_0012c329;
  }
  operator_delete(local_160._M_dataplus._M_p);
LAB_0012c329:
  nlohmann::
  basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>
  ::assert_invariant((basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>
                      *)local_198);
  nlohmann::
  basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>
  ::json_value::destroy((json_value *)(local_198 + 8),local_198[0]);
  return __return_storage_ptr__;
}

Assistant:

Error PendingDatasetFromJson(PendingOperationalDataset &aDataset, const std::string &aJson)
{
    Error error;

    aDataset = PendingOperationalDataset{};

    try
    {
        Json json = Json::parse(StripComments(aJson));
        if (json.is_null())
        {
            error = ERROR_NOT_FOUND("Empty pending operational dataset from JSON");
        }
        else
        {
            aDataset = json;
        }
    } catch (JsonException &e)
    {
        error = e.GetError();
    } catch (std::exception &e)
    {
        error = {ErrorCode::kInvalidArgs, e.what()};
    }

    return error;
}